

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_poll.c
# Opt level: O0

int main(void)

{
  plan(1);
  test_poll();
  return 0;
}

Assistant:

int main()
{
	plan(1);

	test_poll();

	return 0;
}